

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OplsTorsionType.hpp
# Opt level: O0

ostream * OpenMD::operator<<(ostream *os,OplsTorsionType *ott)

{
  ostream *poVar1;
  long in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"This OplsTorsionType has below form:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(in_RDI,*(double *)(in_RSI + 0x38));
  poVar1 = std::operator<<(poVar1,"/2*(1+cos(phi))");
  poVar1 = std::operator<<(poVar1," + ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RSI + 0x40));
  poVar1 = std::operator<<(poVar1,"/2*(1-cos(2*phi))");
  poVar1 = std::operator<<(poVar1," + ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RSI + 0x48));
  poVar1 = std::operator<<(poVar1,"/2*(1+cos(3*phi))");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, OplsTorsionType& ott) {
    os << "This OplsTorsionType has below form:" << std::endl;
    os << ott.v1_ << "/2*(1+cos(phi))"
       << " + " << ott.v2_ << "/2*(1-cos(2*phi))"
       << " + " << ott.v3_ << "/2*(1+cos(3*phi))" << std::endl;
    return os;
  }